

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::piece_picker::is_piece_free
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask)

{
  pointer ppVar1;
  piece_index_t pVar2;
  uint uVar3;
  
  pVar2.m_val = piece.m_val + 0x1f;
  if (-1 < piece.m_val) {
    pVar2.m_val = piece.m_val;
  }
  uVar3 = 0x80000000 >> ((byte)piece.m_val & 0x1f);
  if ((*(uint *)((long)(bitmask->super_bitfield).m_buf.
                       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                 + 4 + (long)(pVar2.m_val >> 5) * 4) &
      (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)) != 0) {
    ppVar1 = (this->m_piece_map).
             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((prio_index_t *)((long)(ppVar1 + piece.m_val) + 4))->m_val != -1) {
      return 0x1fffffff < *(uint *)(ppVar1 + piece.m_val);
    }
  }
  return false;
}

Assistant:

bool piece_picker::is_piece_free(piece_index_t const piece
		, typed_bitfield<piece_index_t> const& bitmask) const
	{
		return bitmask[piece]
			&& !m_piece_map[piece].have()
			&& !m_piece_map[piece].filtered();
	}